

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,Which *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_8UL> *param_5)

{
  CappedArray<char,_8UL> *params;
  CappedArray<char,_8UL> local_40;
  CappedArray<char,_8UL> local_30;
  Which *local_20;
  DebugComparison<capnp::json::Value::Which,_capnp::json::Value::Which> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  local_30 = tryToCharSequence<capnp::json::Value::Which,kj::CappedArray<char,8ul>>(param_2);
  params = (CappedArray<char,_8UL> *)(local_20 + 4);
  local_40 = tryToCharSequence<capnp::json::Value::Which,kj::CappedArray<char,8ul>>(local_20 + 1);
  concat<kj::CappedArray<char,8ul>,kj::StringPtr&,kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,(_ *)&local_30,params,(StringPtr *)&local_40,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}